

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

void __thiscall QObjectPrivate::deleteChildren(QObjectPrivate *this)

{
  undefined1 *puVar1;
  QObjectList *this_00;
  pointer ppQVar2;
  int i;
  ulong uVar3;
  
  puVar1 = &(this->super_QObjectData).field_0x30;
  *puVar1 = *puVar1 | 8;
  this_00 = &(this->super_QObjectData).children;
  for (uVar3 = 0; uVar3 < (ulong)(this->super_QObjectData).children.d.size; uVar3 = uVar3 + 1) {
    this->field_3 =
         *(anon_union_8_2_04744d9a_for_QObjectPrivate_13 *)
          ((this->super_QObjectData).children.d.ptr + uVar3);
    ppQVar2 = QList<QObject_*>::data(this_00);
    ppQVar2[uVar3] = (QObject *)0x0;
    if ((this->field_3).currentChildBeingDeleted != (QObject *)0x0) {
      (*((this->field_3).currentChildBeingDeleted)->_vptr_QObject[4])();
    }
  }
  QList<QObject_*>::clear(this_00);
  (this->field_3).currentChildBeingDeleted = (QObject *)0x0;
  puVar1 = &(this->super_QObjectData).field_0x30;
  *puVar1 = *puVar1 & 0xf7;
  return;
}

Assistant:

void QObjectPrivate::deleteChildren()
{
    Q_ASSERT_X(!isDeletingChildren, "QObjectPrivate::deleteChildren()", "isDeletingChildren already set, did this function recurse?");
    isDeletingChildren = true;
    // delete children objects
    // don't use qDeleteAll as the destructor of the child might
    // delete siblings
    for (int i = 0; i < children.size(); ++i) {
        currentChildBeingDeleted = children.at(i);
        children[i] = nullptr;
        delete currentChildBeingDeleted;
    }
    children.clear();
    currentChildBeingDeleted = nullptr;
    isDeletingChildren = false;
}